

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

void __thiscall
gtest_suite_UnsignedToString_::Max<unsigned_long>::TestBody(Max<unsigned_long> *this)

{
  bool bVar1;
  char *message;
  pair<const_char_*,_const_char_*> pVar2;
  AssertHelper local_c0;
  Message local_b8;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  char *local_40;
  pair<const_char_*,_const_char_*> x;
  unsigned_long max;
  base10storage<TypeParam>_conflict1 out;
  Max<unsigned_long> *this_local;
  
  out._M_elems._12_8_ = this;
  pstore::gsl::not_null<std::array<char,_20UL>_*>::not_null
            ((not_null<std::array<char,_20UL>_*> *)&gtest_ar.message_,
             (array<char,_20UL> *)((long)&max + 4));
  pVar2 = pstore::exchange::export_ns::details::to_characters<unsigned_long,_void>
                    (0xffffffffffffffff,
                     (not_null<std::array<char,_20UL>_*>)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  local_40 = pVar2.first;
  x.first = pVar2.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)&local_78,local_40,x.first,&local_79);
  std::__cxx11::to_string(&local_b0,0xffffffffffffffff);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_58,"(std::string{x.first, x.second})","std::to_string (max)",
             &local_78,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
               ,0x41,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

TYPED_TEST_P (UnsignedToString, Max) {
    using namespace pstore::exchange::export_ns::details;
    base10storage<TypeParam> out;
    auto const max = std::numeric_limits<TypeParam>::max ();
    std::pair<char const *, char const *> const x = to_characters (max, &out);
    EXPECT_EQ ((std::string{x.first, x.second}), std::to_string (max));
}